

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::ConstructorOp::tokenize(ConstructorOp *this,GeneratorState *state,TokenStream *str)

{
  VariableType *pVVar1;
  bool bVar2;
  reference ppEVar3;
  Token local_88;
  reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
  local_78;
  Token local_70;
  undefined1 local_60 [16];
  const_reverse_iterator i;
  Token local_38;
  VariableType *local_28;
  VariableType *type;
  TokenStream *str_local;
  GeneratorState *state_local;
  ConstructorOp *this_local;
  
  type = (VariableType *)str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  local_28 = ValueRange::getType(&this->m_valueRange);
  VariableType::tokenizeShortType(local_28,(TokenStream *)type);
  pVVar1 = type;
  Token::Token(&local_38,LEFT_PAREN);
  TokenStream::operator<<((TokenStream *)pVVar1,&local_38);
  Token::~Token(&local_38);
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rbegin
            ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)
             &stack0xffffffffffffffb0);
  while( true ) {
    std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rend
              ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)(local_60 + 8));
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)&stack0xffffffffffffffb0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)(local_60 + 8));
    pVVar1 = type;
    if (!bVar2) break;
    std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::rbegin
              ((vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_> *)local_60);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)&stack0xffffffffffffffb0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                             *)local_60);
    pVVar1 = type;
    if (bVar2) {
      Token::Token(&local_70,COMMA);
      TokenStream::operator<<((TokenStream *)pVVar1,&local_70);
      Token::~Token(&local_70);
    }
    ppEVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
                           *)&stack0xffffffffffffffb0);
    (*(*ppEVar3)->_vptr_Expression[3])(*ppEVar3,str_local,type);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>_>
    ::operator++(&local_78,(int)&stack0xffffffffffffffb0);
  }
  Token::Token(&local_88,RIGHT_PAREN);
  TokenStream::operator<<((TokenStream *)pVVar1,&local_88);
  Token::~Token(&local_88);
  return;
}

Assistant:

void ConstructorOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	const VariableType& type = m_valueRange.getType();
	DE_ASSERT(type.getPrecision() == VariableType::PRECISION_NONE);
	type.tokenizeShortType(str);

	str << Token::LEFT_PAREN;

	for (vector<Expression*>::const_reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
	{
		if (i != m_inputExpressions.rbegin())
			str << Token::COMMA;
		(*i)->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}